

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qclipboard.cpp
# Opt level: O2

QString * __thiscall
QClipboard::text(QString *__return_storage_ptr__,QClipboard *this,QString *subtype,Mode mode)

{
  Data *pDVar1;
  char16_t *pcVar2;
  bool bVar3;
  char cVar4;
  QMimeData *pQVar5;
  ulong uVar6;
  Encoding *pEVar7;
  QString *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QStringBuilder<QLatin1String,_QString_&> local_d0;
  QArrayDataPointer<char> local_b8;
  QArrayDataPointer<QString> local_98;
  ulong local_80;
  QArrayDataPointer<char16_t> local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = mimeData((QClipboard *)__return_storage_ptr__,mode);
  if (pQVar5 == (QMimeData *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_0029aed1;
  }
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d._0_4_ = 0xaaaaaaaa;
  local_98.d._4_4_ = 0xaaaaaaaa;
  local_98.ptr._0_4_ = 0xaaaaaaaa;
  local_98.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)pQVar5 + 0x68))(&local_98,pQVar5);
  if ((subtype->d).size == 0) {
    cVar4 = QtPrivate::QStringList_contains
                      ((QList_conflict1 *)&local_98,(QLatin1String *)0xa,0x5cd7f1);
    if (cVar4 == '\0') {
      pQVar8 = (QString *)CONCAT44(local_98.ptr._4_4_,local_98.ptr._0_4_);
      for (lVar9 = local_98.size * 0x18; lVar9 != 0; lVar9 = lVar9 + -0x18) {
        cVar4 = QString::startsWith((QLatin1String *)pQVar8,5);
        if (cVar4 != '\0') {
          QString::sliced((QString *)&local_78,pQVar8,5);
          pDVar1 = (subtype->d).d;
          pcVar2 = (subtype->d).ptr;
          (subtype->d).d = local_78.d;
          (subtype->d).ptr = local_78.ptr;
          pQVar8 = (QString *)(subtype->d).size;
          (subtype->d).size = local_78.size;
          local_78.d = pDVar1;
          local_78.ptr = pcVar2;
          local_78.size = (qsizetype)pQVar8;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          break;
        }
        pQVar8 = pQVar8 + 1;
      }
      if ((subtype->d).size == 0) goto LAB_0029acc3;
    }
    else {
      QString::operator=(subtype,(QLatin1String *)0x5);
    }
LAB_0029adce:
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_d0.a.m_size = 5;
    local_d0.a.m_data = "text/";
    local_d0.b = subtype;
    QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>((QString *)&local_78,&local_d0);
    QMimeData::data((QString *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QVar10.m_data = local_b8.ptr;
    QVar10.m_size = local_b8.size;
    uVar6 = QStringConverter::encodingForData(QVar10,L'\0');
    local_80 = 0x100000000;
    if ((uVar6 >> 0x20 & 1) != 0) {
      local_80 = uVar6;
    }
    pEVar7 = std::
             _Optional_base_impl<QStringConverter::Encoding,_std::_Optional_base<QStringConverter::Encoding,_true,_true>_>
             ::_M_get((_Optional_base_impl<QStringConverter::Encoding,_std::_Optional_base<QStringConverter::Encoding,_true,_true>_>
                       *)&local_80);
    local_78.d = (Data *)(&QStringConverter::encodingInterfaces + (ulong)*pEVar7 * 5);
    local_78.ptr = (char16_t *)0x0;
    local_78.size = 0;
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    uStack_48 = 0;
    local_d0.a.m_size = (qsizetype)&local_78;
    local_d0.a.m_data = (char *)&local_b8;
    QStringDecoder::EncodedData::operator_cast_to_QString
              (__return_storage_ptr__,(EncodedData *)&local_d0);
    QStringConverterBase::State::clear();
    QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
  }
  else {
    local_78.d = (Data *)0x5;
    local_78.ptr = L"text/";
    local_78.size = (qsizetype)subtype;
    bVar3 = QListSpecialMethodsBase<QString>::contains<QStringBuilder<QLatin1String,QString&>>
                      ((QListSpecialMethodsBase<QString> *)&local_98,
                       (QStringBuilder<QLatin1String,_QString_&> *)&local_78);
    if (bVar3) goto LAB_0029adce;
LAB_0029acc3:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0029aed1:
  __stack_chk_fail();
}

Assistant:

QString QClipboard::text(QString &subtype, Mode mode) const
{
    const QMimeData *const data = mimeData(mode);
    if (!data)
        return QString();

    const QStringList formats = data->formats();
    if (subtype.isEmpty()) {
        if (formats.contains("text/plain"_L1))
            subtype = "plain"_L1;
        else {
            for (const auto &format : formats) {
                if (format.startsWith("text/"_L1)) {
                    subtype = format.sliced(5);
                    break;
                }
            }
            if (subtype.isEmpty())
                return QString();
        }
    } else if (!formats.contains("text/"_L1 + subtype)) {
        return QString();
    }

    const QByteArray rawData = data->data("text/"_L1 + subtype);
    auto encoding = QStringConverter::encodingForData(rawData);
    if (!encoding)
        encoding = QStringConverter::Utf8;
    return QStringDecoder(*encoding).decode(rawData);
}